

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * tinyformat::format<long>(string *__return_storage_ptr__,char *fmt,long *args)

{
  ostringstream oss;
  ostream oStack_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_198);
  format<long>(&oStack_198,fmt,args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}